

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3StrICmp(char *zLeft,char *zRight)

{
  byte bVar1;
  byte bVar2;
  uchar *b;
  uchar *a;
  long lVar3;
  
  bVar2 = ""[(byte)*zRight];
  bVar1 = ""[(byte)*zLeft];
  if (((ulong)(byte)*zLeft != 0) && (bVar1 == bVar2)) {
    lVar3 = 1;
    do {
      bVar1 = ""[(byte)zLeft[lVar3]];
      bVar2 = ""[(byte)zRight[lVar3]];
      if ((ulong)(byte)zLeft[lVar3] == 0) break;
      lVar3 = lVar3 + 1;
    } while (bVar1 == bVar2);
  }
  return (uint)bVar1 - (uint)bVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3StrICmp(const char *zLeft, const char *zRight){
  unsigned char *a, *b;
  int c;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  for(;;){
    c = (int)UpperToLower[*a] - (int)UpperToLower[*b];
    if( c || *a==0 ) break;
    a++;
    b++;
  }
  return c;
}